

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::HttpSocket::HttpSocket(HttpSocket *this)

{
  HttpSocket *this_local;
  
  TcpSocket::TcpSocket(&this->super_TcpSocket);
  (this->super_TcpSocket)._vptr_TcpSocket = (_func_int **)&PTR__HttpSocket_0011fc98;
  std::__cxx11::string::string((string *)&this->_user_agent);
  std::__cxx11::string::string((string *)&this->_accept_encoding);
  std::__cxx11::string::string((string *)&this->_tmpHdr);
  this->_keep_alive = 0;
  this->_remaining = 0;
  this->_status = 0;
  std::queue<minihttp::Request,std::deque<minihttp::Request,std::allocator<minihttp::Request>>>::
  queue<std::deque<minihttp::Request,std::allocator<minihttp::Request>>,void>
            ((queue<minihttp::Request,std::deque<minihttp::Request,std::allocator<minihttp::Request>>>
              *)&this->_requestQ);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->_hdrs);
  Request::Request(&this->_curRequest);
  this->_inProgress = false;
  this->_chunkedTransfer = false;
  this->_mustClose = true;
  this->_followRedir = true;
  this->_alwaysHandle = false;
  return;
}

Assistant:

HttpSocket::HttpSocket()
	: TcpSocket()
	, _keep_alive(0)
	, _remaining(0)
	, _status(0)
	, _inProgress(false)
	, _chunkedTransfer(false)
	, _mustClose(true)
	, _followRedir(true)
	, _alwaysHandle(false)
{
}